

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UniquenessConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UniquenessConstraintSyntax,slang::parsing::Token&,slang::syntax::OpenRangeListSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,OpenRangeListSyntax *args_1,Token *args_2)

{
  Token unique;
  Token semi;
  UniquenessConstraintSyntax *this_00;
  Token *args_local_2;
  OpenRangeListSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (UniquenessConstraintSyntax *)allocate(this,0x38,8);
  unique.kind = args->kind;
  unique._2_1_ = args->field_0x2;
  unique.numFlags.raw = (args->numFlags).raw;
  unique.rawLen = args->rawLen;
  unique.info = args->info;
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  slang::syntax::UniquenessConstraintSyntax::UniquenessConstraintSyntax(this_00,unique,args_1,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }